

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void update_idle_timeout(quicly_conn_t *conn,int is_in_receive)

{
  uint32_t uVar1;
  int in_ESI;
  long *in_RDI;
  uint32_t three_pto;
  int64_t idle_msec;
  ulong local_30;
  ulong local_18;
  
  if ((in_ESI != 0) || ((*(byte *)(in_RDI + 0x137) & 1) != 0)) {
    local_18 = 0x7fffffffffffffff;
    if ((in_RDI[0xa6] == 0) && ((in_RDI[0xa7] == 0 && (in_RDI[0x56] != 0)))) {
      local_18 = in_RDI[0x56];
    }
    if ((*(long *)(*in_RDI + 0x40) != 0) && (*(ulong *)(*in_RDI + 0x40) < local_18)) {
      local_18 = *(ulong *)(*in_RDI + 0x40);
    }
    if (local_18 != 0x7fffffffffffffff) {
      uVar1 = quicly_rtt_get_pto((quicly_rtt_t *)(in_RDI + 0xc4),(uint)*(ushort *)(*in_RDI + 0x62),
                                 *(uint32_t *)(in_RDI[0xb8] + 4));
      if ((long)(ulong)(uVar1 * 3) < (long)local_18) {
        local_30 = local_18;
      }
      else {
        local_30 = (ulong)(uVar1 * 3);
      }
      in_RDI[0x136] = in_RDI[0x138] + local_30;
      *(byte *)(in_RDI + 0x137) = *(byte *)(in_RDI + 0x137) & 0xfe | (byte)in_ESI & 1;
    }
  }
  return;
}

Assistant:

static void update_idle_timeout(quicly_conn_t *conn, int is_in_receive)
{
    if (!is_in_receive && !conn->idle_timeout.should_rearm_on_send)
        return;

    /* calculate the minimum of the two max_idle_timeout */
    int64_t idle_msec = INT64_MAX;
    if (conn->initial == NULL && conn->handshake == NULL && conn->super.remote.transport_params.max_idle_timeout != 0)
        idle_msec = conn->super.remote.transport_params.max_idle_timeout;
    if (conn->super.ctx->transport_params.max_idle_timeout != 0 && conn->super.ctx->transport_params.max_idle_timeout < idle_msec)
        idle_msec = conn->super.ctx->transport_params.max_idle_timeout;

    if (idle_msec == INT64_MAX)
        return;

    uint32_t three_pto = 3 * quicly_rtt_get_pto(&conn->egress.loss.rtt, conn->super.ctx->transport_params.max_ack_delay,
                                                conn->egress.loss.conf->min_pto);
    conn->idle_timeout.at = conn->stash.now + (idle_msec > three_pto ? idle_msec : three_pto);
    conn->idle_timeout.should_rearm_on_send = is_in_receive;
}